

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O1

void mbedtls_sha1_process(mbedtls_sha1_context *ctx,uchar *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  
  uVar10 = *(uint *)data;
  uVar1 = *(uint *)(data + 4);
  uVar8 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  uVar28 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar10 = *(uint *)(data + 8);
  uVar1 = ctx->state[0];
  uVar2 = ctx->state[1];
  uVar3 = ctx->state[2];
  uVar4 = ctx->state[3];
  uVar5 = ctx->state[4];
  uVar11 = (uVar1 << 5 | uVar1 >> 0x1b) + uVar8 + uVar5 + ((uVar4 ^ uVar3) & uVar2 ^ uVar4) +
           0x5a827999;
  uVar7 = uVar2 << 0x1e | uVar2 >> 2;
  uVar20 = ((uVar7 ^ uVar3) & uVar1 ^ uVar3) + uVar28 + uVar4 + 0x5a827999 +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar16 = uVar1 << 0x1e | uVar1 >> 2;
  uVar29 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  uVar9 = ((uVar7 ^ uVar16) & uVar11 ^ uVar7) + uVar29 + uVar3 + 0x5a827999 +
          (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar10 = *(uint *)(data + 0xc);
  uVar6 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  uVar12 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar7 = uVar7 + uVar6 + ((uVar12 ^ uVar16) & uVar20 ^ uVar16) + 0x5a827999 +
          (uVar9 * 0x20 | uVar9 >> 0x1b);
  uVar10 = *(uint *)(data + 0x10);
  uVar11 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  uVar21 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar17 = uVar16 + uVar11 + ((uVar21 ^ uVar12) & uVar9 ^ uVar12) + 0x5a827999 +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar10 = *(uint *)(data + 0x14);
  uVar16 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  uVar20 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar13 = uVar12 + uVar16 + ((uVar20 ^ uVar21) & uVar7 ^ uVar21) + 0x5a827999 +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar7 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar10 = *(uint *)(data + 0x18);
  uVar9 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  uVar22 = uVar21 + uVar9 + ((uVar7 ^ uVar20) & uVar17 ^ uVar20) + 0x5a827999 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar10 = *(uint *)(data + 0x1c);
  uVar12 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  uVar21 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar17 = uVar20 + uVar12 + ((uVar21 ^ uVar7) & uVar13 ^ uVar7) + 0x5a827999 +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar10 = *(uint *)(data + 0x20);
  uVar15 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  uVar13 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar7 = uVar7 + uVar15 + ((uVar13 ^ uVar21) & uVar22 ^ uVar21) + 0x5a827999 +
          (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar10 = *(uint *)(data + 0x24);
  uVar20 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  uVar23 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar18 = uVar21 + uVar20 + ((uVar23 ^ uVar13) & uVar17 ^ uVar13) + 0x5a827999 +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar22 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar10 = *(uint *)(data + 0x28);
  uVar17 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  uVar14 = uVar13 + uVar17 + ((uVar22 ^ uVar23) & uVar7 ^ uVar23) + 0x5a827999 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar10 = *(uint *)(data + 0x2c);
  uVar13 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  uVar7 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar24 = uVar23 + uVar13 + ((uVar7 ^ uVar22) & uVar18 ^ uVar22) + 0x5a827999 +
           (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar10 = *(uint *)(data + 0x30);
  uVar21 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  uVar19 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar18 = uVar22 + uVar21 + ((uVar19 ^ uVar7) & uVar14 ^ uVar7) + 0x5a827999 +
           (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar10 = *(uint *)(data + 0x34);
  uVar30 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  uVar23 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar14 = uVar7 + uVar30 + ((uVar23 ^ uVar19) & uVar24 ^ uVar19) + 0x5a827999 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar24 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar10 = *(uint *)(data + 0x38);
  uVar7 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  uVar19 = uVar19 + uVar7 + ((uVar24 ^ uVar23) & uVar18 ^ uVar23) + 0x5a827999 +
           (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar10 = *(uint *)(data + 0x3c);
  uVar22 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  uVar10 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar18 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar23 = uVar23 + uVar22 + ((uVar10 ^ uVar24) & uVar14 ^ uVar24) + 0x5a827999 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar14 = uVar15 ^ uVar30 ^ uVar8 ^ uVar29;
  uVar26 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar25 = uVar24 + uVar26 + ((uVar18 ^ uVar10) & uVar19 ^ uVar10) + 0x5a827999 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar14 = uVar20 ^ uVar7 ^ uVar28 ^ uVar6;
  uVar24 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar19 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar8 = uVar10 + uVar19 + ((uVar24 ^ uVar18) & uVar23 ^ uVar18) + 0x5a827999 +
          (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar10 = uVar17 ^ uVar22 ^ uVar29 ^ uVar11;
  uVar23 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar14 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar18 = uVar18 + uVar14 + ((uVar23 ^ uVar24) & uVar25 ^ uVar24) + 0x5a827999 +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar25 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar10 = uVar6 ^ uVar16 ^ uVar13 ^ uVar26;
  uVar10 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar24 = uVar24 + uVar10 + ((uVar25 ^ uVar23) & uVar8 ^ uVar23) + 0x5a827999 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar8 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar6 = uVar11 ^ uVar9 ^ uVar21 ^ uVar19;
  uVar6 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar23 = uVar23 + uVar6 + (uVar8 ^ uVar25 ^ uVar18) + 0x6ed9eba1 +
           (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar11 = uVar16 ^ uVar12 ^ uVar30 ^ uVar14;
  uVar11 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar25 = uVar25 + uVar11 + (uVar18 ^ uVar8 ^ uVar24) + 0x6ed9eba1 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar24 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar16 = uVar9 ^ uVar15 ^ uVar7 ^ uVar10;
  uVar16 = uVar16 << 1 | (uint)((int)uVar16 < 0);
  uVar8 = uVar8 + uVar16 + (uVar24 ^ uVar18 ^ uVar23) + 0x6ed9eba1 +
          (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar23 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar9 = uVar12 ^ uVar20 ^ uVar22 ^ uVar6;
  uVar29 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar28 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar12 = uVar18 + uVar29 + (uVar23 ^ uVar24 ^ uVar25) + 0x6ed9eba1 +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar9 = uVar15 ^ uVar17 ^ uVar26 ^ uVar11;
  uVar18 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar24 = uVar24 + uVar18 + (uVar28 ^ uVar23 ^ uVar8) + 0x6ed9eba1 +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar8 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar9 = uVar20 ^ uVar13 ^ uVar19 ^ uVar16;
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar15 = uVar23 + uVar9 + (uVar8 ^ uVar28 ^ uVar12) + 0x6ed9eba1 +
           (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar23 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar12 = uVar17 ^ uVar21 ^ uVar14 ^ uVar29;
  uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar28 = uVar28 + uVar12 + (uVar23 ^ uVar8 ^ uVar24) + 0x6ed9eba1 +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar25 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar20 = uVar13 ^ uVar30 ^ uVar10 ^ uVar18;
  uVar17 = uVar20 << 1 | (uint)((int)uVar20 < 0);
  uVar24 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar13 = uVar8 + uVar17 + (uVar25 ^ uVar23 ^ uVar15) + 0x6ed9eba1 +
           (uVar28 * 0x20 | uVar28 >> 0x1b);
  uVar20 = uVar21 ^ uVar7 ^ uVar6 ^ uVar9;
  uVar8 = uVar20 << 1 | (uint)((int)uVar20 < 0);
  uVar20 = uVar23 + uVar8 + (uVar24 ^ uVar25 ^ uVar28) + 0x6ed9eba1 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar28 = uVar28 * 0x40000000 | uVar28 >> 2;
  uVar21 = uVar30 ^ uVar22 ^ uVar11 ^ uVar12;
  uVar30 = uVar21 << 1 | (uint)((int)uVar21 < 0);
  uVar15 = uVar25 + uVar30 + (uVar28 ^ uVar24 ^ uVar13) + 0x6ed9eba1 +
           (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar21 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar7 = uVar7 ^ uVar26 ^ uVar16 ^ uVar17;
  uVar7 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar23 = uVar24 + uVar7 + (uVar21 ^ uVar28 ^ uVar20) + 0x6ed9eba1 +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar13 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar20 = uVar22 ^ uVar19 ^ uVar29 ^ uVar8;
  uVar20 = uVar20 << 1 | (uint)((int)uVar20 < 0);
  uVar24 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar15 = uVar28 + uVar20 + (uVar13 ^ uVar21 ^ uVar15) + 0x6ed9eba1 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar22 = uVar26 ^ uVar14 ^ uVar18 ^ uVar30;
  uVar28 = uVar22 << 1 | (uint)((int)uVar22 < 0);
  uVar21 = uVar21 + uVar28 + (uVar24 ^ uVar13 ^ uVar23) + 0x6ed9eba1 +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar23 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar22 = uVar19 ^ uVar10 ^ uVar9 ^ uVar7;
  uVar19 = uVar22 << 1 | (uint)((int)uVar22 < 0);
  uVar13 = uVar13 + uVar19 + (uVar23 ^ uVar24 ^ uVar15) + 0x6ed9eba1 +
           (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar25 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar22 = uVar14 ^ uVar6 ^ uVar12 ^ uVar20;
  uVar26 = uVar22 << 1 | (uint)((int)uVar22 < 0);
  uVar24 = uVar24 + uVar26 + (uVar25 ^ uVar23 ^ uVar21) + 0x6ed9eba1 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar10 = uVar10 ^ uVar11 ^ uVar17 ^ uVar28;
  uVar10 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar22 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar14 = uVar23 + uVar10 + (uVar21 ^ uVar25 ^ uVar13) + 0x6ed9eba1 +
           (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar6 = uVar6 ^ uVar16 ^ uVar8 ^ uVar19;
  uVar15 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar23 = uVar25 + uVar15 + (uVar22 ^ uVar21 ^ uVar24) + 0x6ed9eba1 +
           (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar24 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar6 = uVar11 ^ uVar29 ^ uVar30 ^ uVar26;
  uVar13 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar11 = uVar21 + uVar13 + (uVar24 ^ uVar22 ^ uVar14) + 0x6ed9eba1 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar14 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar6 = uVar16 ^ uVar18 ^ uVar7 ^ uVar10;
  uVar21 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar16 = uVar22 + uVar21 + (uVar14 ^ uVar24 ^ uVar23) + 0x6ed9eba1 +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar25 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar6 = uVar29 ^ uVar9 ^ uVar20 ^ uVar15;
  uVar6 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar23 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar24 = uVar24 + uVar6 + (uVar25 ^ uVar14 ^ uVar11) + 0x6ed9eba1 +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar11 = uVar18 ^ uVar12 ^ uVar28 ^ uVar13;
  uVar22 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar18 = uVar14 + uVar22 + ((uVar16 | uVar23) & uVar25 | uVar16 & uVar23) + -0x70e44324 +
           (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar14 = uVar16 * 0x40000000 | uVar16 >> 2;
  uVar11 = uVar9 ^ uVar17 ^ uVar19 ^ uVar21;
  uVar29 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar25 = uVar25 + uVar29 + ((uVar24 | uVar14) & uVar23 | uVar24 & uVar14) + -0x70e44324 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar24 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar11 = uVar12 ^ uVar8 ^ uVar26 ^ uVar6;
  uVar11 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar9 = uVar23 + uVar11 + ((uVar18 | uVar24) & uVar14 | uVar18 & uVar24) + -0x70e44324 +
          (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar16 = uVar17 ^ uVar30 ^ uVar10 ^ uVar22;
  uVar12 = uVar16 << 1 | (uint)((int)uVar16 < 0);
  uVar16 = uVar14 + uVar12 + ((uVar25 | uVar18) & uVar24 | uVar25 & uVar18) + -0x70e44324 +
           (uVar9 * 0x20 | uVar9 >> 0x1b);
  uVar25 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar17 = uVar8 ^ uVar7 ^ uVar15 ^ uVar29;
  uVar23 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar8 = uVar24 + uVar23 + ((uVar9 | uVar25) & uVar18 | uVar9 & uVar25) + -0x70e44324 +
          (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar9 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar17 = uVar30 ^ uVar20 ^ uVar13 ^ uVar11;
  uVar30 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar14 = uVar18 + uVar30 + ((uVar16 | uVar9) & uVar25 | uVar16 & uVar9) + -0x70e44324 +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar16 = uVar16 * 0x40000000 | uVar16 >> 2;
  uVar7 = uVar7 ^ uVar28 ^ uVar21 ^ uVar12;
  uVar17 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar18 = uVar25 + uVar17 + ((uVar8 | uVar16) & uVar9 | uVar8 & uVar16) + -0x70e44324 +
           (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar8 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar7 = uVar20 ^ uVar19 ^ uVar6 ^ uVar23;
  uVar7 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar9 = uVar9 + uVar7 + ((uVar14 | uVar8) & uVar16 | uVar14 & uVar8) + -0x70e44324 +
          (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar14 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar20 = uVar28 ^ uVar26 ^ uVar22 ^ uVar30;
  uVar28 = uVar20 << 1 | (uint)((int)uVar20 < 0);
  uVar16 = uVar16 + uVar28 + ((uVar18 | uVar14) & uVar8 | uVar18 & uVar14) + -0x70e44324 +
           (uVar9 * 0x20 | uVar9 >> 0x1b);
  uVar24 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar20 = uVar19 ^ uVar10 ^ uVar29 ^ uVar17;
  uVar18 = uVar20 << 1 | (uint)((int)uVar20 < 0);
  uVar19 = uVar8 + uVar18 + ((uVar9 | uVar24) & uVar14 | uVar9 & uVar24) + -0x70e44324 +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar20 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar9 = uVar26 ^ uVar15 ^ uVar11 ^ uVar7;
  uVar26 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar8 = uVar14 + uVar26 + ((uVar16 | uVar20) & uVar24 | uVar16 & uVar20) + -0x70e44324 +
          (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar9 = uVar16 * 0x40000000 | uVar16 >> 2;
  uVar10 = uVar10 ^ uVar13 ^ uVar12 ^ uVar28;
  uVar10 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar25 = uVar24 + uVar10 + ((uVar19 | uVar9) & uVar20 | uVar19 & uVar9) + -0x70e44324 +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar24 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar16 = uVar15 ^ uVar21 ^ uVar23 ^ uVar18;
  uVar16 = uVar16 << 1 | (uint)((int)uVar16 < 0);
  uVar14 = uVar20 + uVar16 + ((uVar8 | uVar24) & uVar9 | uVar8 & uVar24) + -0x70e44324 +
           (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar8 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar20 = uVar13 ^ uVar6 ^ uVar30 ^ uVar26;
  uVar19 = uVar20 << 1 | (uint)((int)uVar20 < 0);
  uVar20 = uVar9 + uVar19 + ((uVar25 | uVar8) & uVar24 | uVar25 & uVar8) + -0x70e44324 +
           (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar15 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar9 = uVar21 ^ uVar22 ^ uVar17 ^ uVar10;
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar13 = uVar24 + uVar9 + ((uVar14 | uVar15) & uVar8 | uVar14 & uVar15) + -0x70e44324 +
           (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar14 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar6 = uVar6 ^ uVar29 ^ uVar7 ^ uVar16;
  uVar6 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar8 = uVar8 + uVar6 + ((uVar20 | uVar14) & uVar15 | uVar20 & uVar14) + -0x70e44324 +
          (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar21 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar20 = uVar22 ^ uVar11 ^ uVar28 ^ uVar19;
  uVar20 = uVar20 << 1 | (uint)((int)uVar20 < 0);
  uVar24 = uVar15 + uVar20 + ((uVar13 | uVar21) & uVar14 | uVar13 & uVar21) + -0x70e44324 +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar15 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar13 = uVar29 ^ uVar12 ^ uVar18 ^ uVar9;
  uVar13 = uVar13 << 1 | (uint)((int)uVar13 < 0);
  uVar22 = uVar14 + uVar13 + ((uVar8 | uVar15) & uVar21 | uVar8 & uVar15) + -0x70e44324 +
           (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar14 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar11 = uVar11 ^ uVar23 ^ uVar26 ^ uVar6;
  uVar25 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar21 = uVar21 + uVar25 + ((uVar24 | uVar14) & uVar15 | uVar24 & uVar14) + -0x70e44324 +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar24 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar11 = uVar12 ^ uVar30 ^ uVar10 ^ uVar20;
  uVar12 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar8 = uVar15 + uVar12 + ((uVar22 | uVar24) & uVar14 | uVar22 & uVar24) + -0x70e44324 +
          (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar11 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar22 = uVar23 ^ uVar17 ^ uVar16 ^ uVar13;
  uVar29 = uVar22 << 1 | (uint)((int)uVar22 < 0);
  uVar22 = uVar14 + uVar29 + (uVar11 ^ uVar24 ^ uVar21) + -0x359d3e2a +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar14 = uVar30 ^ uVar7 ^ uVar19 ^ uVar25;
  uVar31 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar23 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar8 = uVar24 + uVar31 + (uVar21 ^ uVar11 ^ uVar8) + -0x359d3e2a +
          (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar17 = uVar17 ^ uVar28 ^ uVar9 ^ uVar12;
  uVar30 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar17 = uVar11 + uVar30 + (uVar23 ^ uVar21 ^ uVar22) + -0x359d3e2a +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar14 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar7 = uVar7 ^ uVar18 ^ uVar6 ^ uVar29;
  uVar11 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar7 = uVar21 + uVar11 + (uVar14 ^ uVar23 ^ uVar8) + -0x359d3e2a +
          (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar15 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar21 = uVar28 ^ uVar26 ^ uVar20 ^ uVar31;
  uVar24 = uVar21 << 1 | (uint)((int)uVar21 < 0);
  uVar8 = uVar23 + uVar24 + (uVar15 ^ uVar14 ^ uVar17) + -0x359d3e2a +
          (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar21 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar17 = uVar18 ^ uVar10 ^ uVar13 ^ uVar30;
  uVar22 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar17 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar7 = uVar14 + uVar22 + (uVar21 ^ uVar15 ^ uVar7) + -0x359d3e2a + (uVar8 * 0x20 | uVar8 >> 0x1b)
  ;
  uVar14 = uVar26 ^ uVar16 ^ uVar25 ^ uVar11;
  uVar18 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar15 = uVar15 + uVar18 + (uVar17 ^ uVar21 ^ uVar8) + -0x359d3e2a +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar23 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar10 = uVar10 ^ uVar19 ^ uVar12 ^ uVar24;
  uVar28 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar21 = uVar21 + uVar28 + (uVar23 ^ uVar17 ^ uVar7) + -0x359d3e2a +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar14 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar10 = uVar16 ^ uVar9 ^ uVar29 ^ uVar22;
  uVar8 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar7 = uVar17 + uVar8 + (uVar14 ^ uVar23 ^ uVar15) + -0x359d3e2a +
          (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar15 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar10 = uVar19 ^ uVar6 ^ uVar31 ^ uVar18;
  uVar10 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar17 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar21 = uVar23 + uVar10 + (uVar15 ^ uVar14 ^ uVar21) + -0x359d3e2a +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar16 = uVar9 ^ uVar20 ^ uVar30 ^ uVar28;
  uVar23 = uVar16 << 1 | (uint)((int)uVar16 < 0);
  uVar9 = uVar14 + uVar23 + (uVar17 ^ uVar15 ^ uVar7) + -0x359d3e2a +
          (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar16 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar7 = uVar6 ^ uVar13 ^ uVar11 ^ uVar8;
  uVar19 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar14 = uVar15 + uVar19 + (uVar16 ^ uVar17 ^ uVar21) + -0x359d3e2a +
           (uVar9 * 0x20 | uVar9 >> 0x1b);
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar7 = uVar20 ^ uVar25 ^ uVar24 ^ uVar10;
  uVar7 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar20 = uVar17 + uVar7 + (uVar21 ^ uVar16 ^ uVar9) + -0x359d3e2a +
           (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar17 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar6 = uVar13 ^ uVar12 ^ uVar22 ^ uVar23;
  uVar9 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar16 = uVar16 + uVar9 + (uVar17 ^ uVar21 ^ uVar14) + -0x359d3e2a +
           (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar14 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar6 = uVar25 ^ uVar29 ^ uVar18 ^ uVar19;
  uVar6 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar13 = uVar21 + uVar6 + (uVar14 ^ uVar17 ^ uVar20) + -0x359d3e2a +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar7 = uVar12 ^ uVar31 ^ uVar28 ^ uVar7;
  uVar7 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar12 = uVar17 + uVar7 + (uVar20 ^ uVar14 ^ uVar16) + -0x359d3e2a +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar9 = uVar29 ^ uVar30 ^ uVar8 ^ uVar9;
  uVar16 = uVar16 * 0x40000000 | uVar16 >> 2;
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar21 = uVar14 + uVar9 + (uVar16 ^ uVar20 ^ uVar13) + -0x359d3e2a +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar6 = uVar31 ^ uVar11 ^ uVar10 ^ uVar6;
  uVar17 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar20 = (uVar6 << 1 | (uint)((int)uVar6 < 0)) + uVar20 + (uVar17 ^ uVar16 ^ uVar12) + -0x359d3e2a
           + (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar7 = uVar24 ^ uVar30 ^ uVar23 ^ uVar7;
  uVar6 = uVar12 * 0x40000000 | uVar12 >> 2;
  iVar27 = (uVar7 << 1 | (uint)((int)uVar7 < 0)) + uVar16 + (uVar6 ^ uVar17 ^ uVar21) +
           (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar9 = uVar22 ^ uVar11 ^ uVar19 ^ uVar9;
  uVar7 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar10 = iVar27 + 0xca62c1d6;
  ctx->state[0] =
       (uVar9 << 1 | (uint)((int)uVar9 < 0)) + uVar1 + uVar17 + (uVar7 ^ uVar6 ^ uVar20) +
       -0x359d3e2a + (uVar10 * 0x20 | uVar10 >> 0x1b);
  ctx->state[1] = uVar2 + iVar27 + 0xca62c1d6;
  ctx->state[2] = (uVar20 * 0x40000000 | uVar20 >> 2) + uVar3;
  ctx->state[3] = uVar7 + uVar4;
  ctx->state[4] = uVar6 + uVar5;
  return;
}

Assistant:

void mbedtls_sha1_process( mbedtls_sha1_context *ctx, const unsigned char data[64] )
{
    uint32_t temp, W[16], A, B, C, D, E;

    GET_UINT32_BE( W[ 0], data,  0 );
    GET_UINT32_BE( W[ 1], data,  4 );
    GET_UINT32_BE( W[ 2], data,  8 );
    GET_UINT32_BE( W[ 3], data, 12 );
    GET_UINT32_BE( W[ 4], data, 16 );
    GET_UINT32_BE( W[ 5], data, 20 );
    GET_UINT32_BE( W[ 6], data, 24 );
    GET_UINT32_BE( W[ 7], data, 28 );
    GET_UINT32_BE( W[ 8], data, 32 );
    GET_UINT32_BE( W[ 9], data, 36 );
    GET_UINT32_BE( W[10], data, 40 );
    GET_UINT32_BE( W[11], data, 44 );
    GET_UINT32_BE( W[12], data, 48 );
    GET_UINT32_BE( W[13], data, 52 );
    GET_UINT32_BE( W[14], data, 56 );
    GET_UINT32_BE( W[15], data, 60 );

#define S(x,n) ((x << n) | ((x & 0xFFFFFFFF) >> (32 - n)))

#define R(t)                                            \
(                                                       \
    temp = W[( t -  3 ) & 0x0F] ^ W[( t - 8 ) & 0x0F] ^ \
           W[( t - 14 ) & 0x0F] ^ W[  t       & 0x0F],  \
    ( W[t & 0x0F] = S(temp,1) )                         \
)

#define P(a,b,c,d,e,x)                                  \
{                                                       \
    e += S(a,5) + F(b,c,d) + K + x; b = S(b,30);        \
}

    A = ctx->state[0];
    B = ctx->state[1];
    C = ctx->state[2];
    D = ctx->state[3];
    E = ctx->state[4];

#define F(x,y,z) (z ^ (x & (y ^ z)))
#define K 0x5A827999

    P( A, B, C, D, E, W[0]  );
    P( E, A, B, C, D, W[1]  );
    P( D, E, A, B, C, W[2]  );
    P( C, D, E, A, B, W[3]  );
    P( B, C, D, E, A, W[4]  );
    P( A, B, C, D, E, W[5]  );
    P( E, A, B, C, D, W[6]  );
    P( D, E, A, B, C, W[7]  );
    P( C, D, E, A, B, W[8]  );
    P( B, C, D, E, A, W[9]  );
    P( A, B, C, D, E, W[10] );
    P( E, A, B, C, D, W[11] );
    P( D, E, A, B, C, W[12] );
    P( C, D, E, A, B, W[13] );
    P( B, C, D, E, A, W[14] );
    P( A, B, C, D, E, W[15] );
    P( E, A, B, C, D, R(16) );
    P( D, E, A, B, C, R(17) );
    P( C, D, E, A, B, R(18) );
    P( B, C, D, E, A, R(19) );

#undef K
#undef F

#define F(x,y,z) (x ^ y ^ z)
#define K 0x6ED9EBA1

    P( A, B, C, D, E, R(20) );
    P( E, A, B, C, D, R(21) );
    P( D, E, A, B, C, R(22) );
    P( C, D, E, A, B, R(23) );
    P( B, C, D, E, A, R(24) );
    P( A, B, C, D, E, R(25) );
    P( E, A, B, C, D, R(26) );
    P( D, E, A, B, C, R(27) );
    P( C, D, E, A, B, R(28) );
    P( B, C, D, E, A, R(29) );
    P( A, B, C, D, E, R(30) );
    P( E, A, B, C, D, R(31) );
    P( D, E, A, B, C, R(32) );
    P( C, D, E, A, B, R(33) );
    P( B, C, D, E, A, R(34) );
    P( A, B, C, D, E, R(35) );
    P( E, A, B, C, D, R(36) );
    P( D, E, A, B, C, R(37) );
    P( C, D, E, A, B, R(38) );
    P( B, C, D, E, A, R(39) );

#undef K
#undef F

#define F(x,y,z) ((x & y) | (z & (x | y)))
#define K 0x8F1BBCDC

    P( A, B, C, D, E, R(40) );
    P( E, A, B, C, D, R(41) );
    P( D, E, A, B, C, R(42) );
    P( C, D, E, A, B, R(43) );
    P( B, C, D, E, A, R(44) );
    P( A, B, C, D, E, R(45) );
    P( E, A, B, C, D, R(46) );
    P( D, E, A, B, C, R(47) );
    P( C, D, E, A, B, R(48) );
    P( B, C, D, E, A, R(49) );
    P( A, B, C, D, E, R(50) );
    P( E, A, B, C, D, R(51) );
    P( D, E, A, B, C, R(52) );
    P( C, D, E, A, B, R(53) );
    P( B, C, D, E, A, R(54) );
    P( A, B, C, D, E, R(55) );
    P( E, A, B, C, D, R(56) );
    P( D, E, A, B, C, R(57) );
    P( C, D, E, A, B, R(58) );
    P( B, C, D, E, A, R(59) );

#undef K
#undef F

#define F(x,y,z) (x ^ y ^ z)
#define K 0xCA62C1D6

    P( A, B, C, D, E, R(60) );
    P( E, A, B, C, D, R(61) );
    P( D, E, A, B, C, R(62) );
    P( C, D, E, A, B, R(63) );
    P( B, C, D, E, A, R(64) );
    P( A, B, C, D, E, R(65) );
    P( E, A, B, C, D, R(66) );
    P( D, E, A, B, C, R(67) );
    P( C, D, E, A, B, R(68) );
    P( B, C, D, E, A, R(69) );
    P( A, B, C, D, E, R(70) );
    P( E, A, B, C, D, R(71) );
    P( D, E, A, B, C, R(72) );
    P( C, D, E, A, B, R(73) );
    P( B, C, D, E, A, R(74) );
    P( A, B, C, D, E, R(75) );
    P( E, A, B, C, D, R(76) );
    P( D, E, A, B, C, R(77) );
    P( C, D, E, A, B, R(78) );
    P( B, C, D, E, A, R(79) );

#undef K
#undef F

    ctx->state[0] += A;
    ctx->state[1] += B;
    ctx->state[2] += C;
    ctx->state[3] += D;
    ctx->state[4] += E;
}